

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsVariable.h
# Opt level: O2

void __thiscall
AdsVariable<unsigned_char>::Read(AdsVariable<unsigned_char> *this,size_t size,void *data)

{
  long adsErrorCode;
  AdsException *this_00;
  uint32_t bytesRead;
  
  adsErrorCode = AdsDevice::ReadReqEx2
                           ((uint)this->m_Route,this->m_IndexGroup,
                            (ulong)*(this->m_Handle)._M_t.
                                    super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>
                                    .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,
                            (void *)size,(uint *)data);
  if ((adsErrorCode == 0) && (size == 0)) {
    return;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,adsErrorCode);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

void Read(const size_t size, void* data) const
    {
        uint32_t bytesRead = 0;
        auto error = m_Route.ReadReqEx2(m_IndexGroup,
                                        *m_Handle,
                                        size,
                                        data,
                                        &bytesRead);

        if (error || (size != bytesRead)) {
            throw AdsException(error);
        }
    }